

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

uint8_t * get_route(routeindex_t index)

{
  return get_route::routes[index & 0x7f];
}

Assistant:

const uint8_t *get_route(routeindex_t index)
{
  /** Specifies a door within a route. */
#define DOOR(d) (d)
  /** Specifies a location index (in locations[]) within a route. */
#define LOCATION(d) (d + 40)

  static const uint8_t route_7795[] =
  {
    LOCATION(32),
    LOCATION(33),
    LOCATION(34),
    routebyte_END
  };
  static const uint8_t route_7799[] =
  {
    LOCATION(35),
    LOCATION(36),
    LOCATION(37),
    LOCATION(38),
    LOCATION(39),
    LOCATION(40),
    routebyte_END
  };
  /* I believe this to be the commandant's route. It's the longest and most
   * complex of the routes. */
  static const uint8_t route_commandant[] =
  {
    LOCATION(46),
    DOOR(31),                 // room_11_PAPERS   -> room_13_CORRIDOR
    DOOR(29),                 // room_13_CORRIDOR -> room_16_CORRIDOR
    DOOR(32),                 // room_16_CORRIDOR -> room_7_CORRIDOR
    DOOR(26),                 // room_7_CORRIDOR  -> room_17_CORRIDOR
    DOOR(35),                 // room_17_CORRIDOR -> room_12_CORRIDOR
    DOOR(25 | door_REVERSE),  // room_12_CORRIDOR -> room_18_RADIO
    DOOR(22 | door_REVERSE),  // room_18_RADIO    -> room_19_FOOD
    DOOR(21 | door_REVERSE),  // room_19_FOOD     -> room_23_MESS_HALL
    DOOR(20 | door_REVERSE),  // room_23_MESS_HALL-> room_21_CORRIDOR
    DOOR(23 | door_REVERSE),  // room_21_CORRIDOR -> room_22_REDKEY
    LOCATION(42),
    DOOR(23),                 // room_22_REDKEY   -> room_21_CORRIDOR
    DOOR(10 | door_REVERSE),  // room_21_CORRIDOR -> room_0_OUTDOORS
    DOOR(11),                 // room_0_OUTDOORS  -> room_20_REDCROSS
    DOOR(11 | door_REVERSE),  // room_20_REDCROSS -> room_0_OUTDOORS
    DOOR(12),                 // room_0_OUTDOORS  -> room_15_UNIFORM
    DOOR(27 | door_REVERSE),  // room_15_UNIFORM  -> room_14_TORCH
    DOOR(28),                 // room_14_TORCH    -> room_16_CORRIDOR
    DOOR(29 | door_REVERSE),  // room_16_CORRIDOR -> room_13_CORRIDOR
    DOOR(13 | door_REVERSE),  // room_13_CORRIDOR -> room_0_OUTDOORS
    LOCATION(11),             // charevnt_commandant_to_yard jumps to this offset
    LOCATION(55),
    DOOR( 0 | door_REVERSE),  // room_0_OUTDOORS  -> room_0_OUTDOORS (gate 0 to yard)
    DOOR( 1 | door_REVERSE),  // room_0_OUTDOORS  -> room_0_OUTDOORS (gate 1 to yard)
    LOCATION(60),
    DOOR( 1),                 // room_0_OUTDOORS  -> room_0_OUTDOORS (return through gate 1)
    DOOR( 0),                 // room_0_OUTDOORS  -> room_0_OUTDOORS (return through gate 0)
    DOOR( 4),                 // room_0_OUTDOORS  -> room_28_HUT1LEFT
    DOOR(16),                 // room_28_HUT1LEFT -> room_1_HUT1RIGHT
    DOOR( 5 | door_REVERSE),  // room_1_HUT1RIGHT -> room_0_OUTDOORS
    LOCATION(11),
    DOOR( 7),                 // room_0_OUTDOORS  -> room_3_HUT2RIGHT
    DOOR(17 | door_REVERSE),  // room_3_HUT2RIGHT -> room_2_HUT2LEFT
    DOOR( 6 | door_REVERSE),  // room_2_HUT2LEFT  -> room_0_OUTDOORS
    DOOR( 8),                 // room_0_OUTDOORS  -> room_4_HUT3LEFT
    DOOR(18),                 // room_4_HUT3LEFT  -> room_5_HUT3RIGHT
    DOOR( 9 | door_REVERSE),  // room_5_HUT3RIGHT -> room_0_OUTDOORS
    LOCATION(45),
    DOOR(14),                 // room_0_OUTDOORS  -> room_8_CORRIDOR
    DOOR(34),                 // room_8_CORRIDOR  -> room_9_CRATE
    DOOR(34 | door_REVERSE),  // room_9_CRATE     -> room_8_CORRIDOR
    DOOR(33),                 // room_8_CORRIDOR  -> room_10_LOCKPICK
    DOOR(33 | door_REVERSE),  // room_10_LOCKPICK -> room_8_CORRIDOR
    routebyte_END
  };
  static const uint8_t route_77CD[] =
  {
    LOCATION(43),
    LOCATION(44),
    routebyte_END
  };
  static const uint8_t route_exit_hut2[] =
  {
    DOOR(7 | door_REVERSE),   // room_3_HUT2RIGHT -> room_0_OUTDOORS
    LOCATION(11),
    LOCATION(12),
    routebyte_END
  };
  static const uint8_t route_exit_hut3[] =
  {
    DOOR(9 | door_REVERSE),   // room_5_HUT3RIGHT -> room_0_OUTDOORS
    LOCATION(45),
    LOCATION(14),
    routebyte_END
  };
  static const uint8_t route_prisoner_sleeps_1[] =
  {
    LOCATION(46),
    routebyte_END
  };
  static const uint8_t route_prisoner_sleeps_2[] =
  {
    LOCATION(47),
    routebyte_END
  };
  static const uint8_t route_prisoner_sleeps_3[] =
  {
    LOCATION(48),
    routebyte_END
  };
  static const uint8_t route_77DE[] =
  {
    LOCATION(52),
    LOCATION(53),
    routebyte_END
  };
  static const uint8_t route_go_to_yard[] =
  {
    LOCATION(11),
    LOCATION(55),
    DOOR(0 | door_REVERSE),   // move through gates
    DOOR(1 | door_REVERSE),   // move through gates to yard
    LOCATION(56),
    routebyte_END
  };
  static const uint8_t route_breakfast_room_25[] =
  {
    LOCATION(12),             // 93,104
    DOOR(10),                 // room_0_OUTDOORS   -> room_21_CORRIDOR
    DOOR(20),                 // room_21_CORRIDOR  -> room_23_MESS_HALL
    DOOR(19 | door_REVERSE),  // room_23_MESS_HALL -> room_25_MESS_HALL
    routebyte_END
  };
  static const uint8_t route_breakfast_room_23[] =
  {
    LOCATION(16),
    LOCATION(12),
    DOOR(10),                 // room_0_OUTDOORS  -> room_21_CORRIDOR
    DOOR(20),                 // room_21_CORRIDOR -> room_23_MESS_HALL
    routebyte_END
  };
  static const uint8_t route_prisoner_sits_1[] =
  {
    LOCATION(64),
    routebyte_END
  };
  static const uint8_t route_prisoner_sits_2[] =
  {
    LOCATION(65),
    routebyte_END
  };
  static const uint8_t route_prisoner_sits_3[] =
  {
    LOCATION(66),
    routebyte_END
  };
  static const uint8_t route_guardA_breakfast[] =
  {
    LOCATION(68),
    routebyte_END
  };
  static const uint8_t route_guardB_breakfast[] =
  {
    LOCATION(69),
    routebyte_END
  };
  static const uint8_t route_guard_12_roll_call[] =
  {
    LOCATION(9),
    routebyte_END
  };
  static const uint8_t route_guard_13_roll_call[] =
  {
    LOCATION(11),
    routebyte_END
  };
  static const uint8_t route_guard_14_roll_call[] =
  {
    LOCATION(17),
    routebyte_END
  };
  static const uint8_t route_guard_15_roll_call[] =
  {
    LOCATION(49),
    routebyte_END
  };
  static const uint8_t route_prisoner_1_roll_call[] =
  {
    LOCATION(72),
    routebyte_END
  };
  static const uint8_t route_prisoner_2_roll_call[] =
  {
    LOCATION(73),
    routebyte_END
  };
  static const uint8_t route_prisoner_3_roll_call[] =
  {
    LOCATION(74),
    routebyte_END
  };
  static const uint8_t route_prisoner_4_roll_call[] =
  {
    LOCATION(75),
    routebyte_END
  };
  static const uint8_t route_prisoner_5_roll_call[] =
  {
    LOCATION(76),
    routebyte_END
  };
  static const uint8_t route_prisoner_6_roll_call[] =
  {
    LOCATION(77),
    routebyte_END
  };
  static const uint8_t route_go_to_solitary[] =
  {
    LOCATION(14),
    DOOR(10),                 // room_0_OUTDOORS  -> room_21_CORRIDOR
    DOOR(23 | door_REVERSE),  // room_21_CORRIDOR -> room_22_REDKEY
    DOOR(24 | door_REVERSE),  // room_22_REDKEY   -> room_24_SOLITARY
    LOCATION(42),
    routebyte_END
  };
  static const uint8_t route_hero_leave_solitary[] =
  {
    DOOR(24),                 // room_24_SOLITARY -> room_22_REDKEY
    DOOR(23),                 // room_22_REDKEY   -> room_21_CORRIDOR
    DOOR(10 | door_REVERSE),  // room_21_CORRIDOR -> room_0_OUTDOORS
    LOCATION(14),
    routebyte_END
  };
  static const uint8_t route_guard_12_bed[] =
  {
    LOCATION(12),
    LOCATION(11),
    DOOR(7),                  // room_0_OUTDOORS -> room_3_HUT2RIGHT
    LOCATION(52),
    routebyte_END
  };
  static const uint8_t route_guard_13_bed[] =
  {
    LOCATION(12),
    LOCATION(11),
    DOOR(7),                  // room_0_OUTDOORS  -> room_3_HUT2RIGHT
    DOOR(17 | door_REVERSE),  // room_3_HUT2RIGHT -> room_2_HUT2LEFT
    LOCATION(53),
    routebyte_END
  };
  static const uint8_t route_guard_14_bed[] =
  {
    LOCATION(12),
    LOCATION(11),
    LOCATION(45),
    DOOR(9),                  // room_0_OUTDOORS -> room_5_HUT3RIGHT
    LOCATION(52),
    routebyte_END
  };
  static const uint8_t route_guard_15_bed[] =
  {
    LOCATION(12),
    LOCATION(11),
    LOCATION(45),
    DOOR(9),                  // room_0_OUTDOORS -> room_5_HUT3RIGHT
    LOCATION(53),
    routebyte_END
  };
  static const uint8_t route_hut2_left_to_right[] =
  {
    DOOR(17),                 // room_2_HUT2LEFT -> room_3_HUT2RIGHT
    routebyte_END
  };
  static const uint8_t route_7833[] =
  {
    LOCATION(67),             // 52,62
    routebyte_END
  };
  static const uint8_t route_hut2_right_to_left[] =
  {
    DOOR(17 | door_REVERSE),  // room_3_HUT2RIGHT -> room_2_HUT2LEFT
    LOCATION(70),             // 42,46 // go to bed?
    routebyte_END
  };
  static const uint8_t route_hero_roll_call[] =
  {
    LOCATION(50),
    routebyte_END
  };
#undef DOOR
#undef LOCATION

  /**
   * $7738: Table of pointers to routes.
   */
  static const uint8_t *routes[routeindex__LIMIT] =
  {
    NULL, /* was zero */            //  0: route 0 => stand still (as opposed to route 255 => wander around randomly)  hero in solitary

    &route_7795[0],                 //  1: L-shaped route in the fenced area
    &route_7799[0],                 //  2: guard's route around the front perimeter wall
    &route_commandant[0],           //  3: the commandant's route - the longest of all the routes
    &route_77CD[0],                 //  4: guard's route marching over the front gate

    &route_exit_hut2[0],            //  5: character_1x_GUARD_12/13, character_2x_PRISONER_1/2/3 by wake_up & go_to_time_for_bed, go_to_time_for_bed (for hero),
    &route_exit_hut3[0],            //  6: character_1x_GUARD_14/15, character_2x_PRISONER_4/5/6 by wake_up & go_to_time_for_bed

    // character_sleeps routes
    &route_prisoner_sleeps_1[0],    //  7: prisoner 1 by character_bed_common
    &route_prisoner_sleeps_2[0],    //  8: prisoner 2 by character_bed_common
    &route_prisoner_sleeps_3[0],    //  9: prisoner 3 by character_bed_common
    &route_prisoner_sleeps_1[0],    // 10: prisoner 4 by character_bed_common /* dupes index 7 */
    &route_prisoner_sleeps_2[0],    // 11: prisoner 5 by character_bed_common /* dupes index 8 */
    &route_prisoner_sleeps_3[0],    // 12: prisoner 6 by character_bed_common /* dupes index 9 */

    &route_77DE[0],                 // 13: (all hostiles) by character_bed_common

    &route_go_to_yard[0],           // 14: set by set_route_go_to_yard_reversed (for hero, prisoners_and_guards-1), set_route_go_to_yard (for hero, prisoners_and_guards-1)
    &route_go_to_yard[0],           // 15: set by set_route_go_to_yard_reversed (for hero, prisoners_and_guards-2), set_route_go_to_yard (for hero, prisoners_and_guards-2)  /* dupes index 14 */

    &route_breakfast_room_25[0],    // 16: set by set_route_go_to_breakfast, end_of_breakfast (for hero, reversed), prisoners_and_guards-1 by end_of_breakfast
    &route_breakfast_room_23[0],    // 17:                                                                          prisoners_and_guards-2 by end_of_breakfast

    // character_sits routes
    &route_prisoner_sits_1[0],      // 18: character_20_PRISONER_1 by charevnt_breakfast_common  // character next to player when player seated
    &route_prisoner_sits_2[0],      // 19: character_21_PRISONER_2 by charevnt_breakfast_common
    &route_prisoner_sits_3[0],      // 20: character_22_PRISONER_3 by charevnt_breakfast_common
    &route_prisoner_sits_1[0],      // 21: character_23_PRISONER_4 by charevnt_breakfast_common  /* dupes index 18 */
    &route_prisoner_sits_2[0],      // 22: character_24_PRISONER_5 by charevnt_breakfast_common  /* dupes index 19 */
    &route_prisoner_sits_3[0],      // 23: character_25_PRISONER_6 by charevnt_breakfast_common  /* dupes index 20 */ // looks like it belongs with above chunk but not used (bug)

    &route_guardA_breakfast[0],     // 24: "even guard" by charevnt_breakfast_common
    &route_guardB_breakfast[0],     // 25: "odd guard" by charevnt_breakfast_common

    &route_guard_12_roll_call[0],   // 26: character_12_GUARD_12   by go_to_roll_call
    &route_guard_13_roll_call[0],   // 27: character_13_GUARD_13   by go_to_roll_call
    &route_prisoner_1_roll_call[0], // 28: character_20_PRISONER_1 by go_to_roll_call
    &route_prisoner_2_roll_call[0], // 29: character_21_PRISONER_2 by go_to_roll_call
    &route_prisoner_3_roll_call[0], // 30: character_22_PRISONER_3 by go_to_roll_call
    &route_guard_14_roll_call[0],   // 31: character_14_GUARD_14   by go_to_roll_call
    &route_guard_15_roll_call[0],   // 32: character_15_GUARD_15   by go_to_roll_call
    &route_prisoner_4_roll_call[0], // 33: character_23_PRISONER_4 by go_to_roll_call
    &route_prisoner_5_roll_call[0], // 34: character_24_PRISONER_5 by go_to_roll_call
    &route_prisoner_6_roll_call[0], // 35: character_25_PRISONER_6 by go_to_roll_call

    &route_go_to_solitary[0],       // 36: set by charevnt_hero_release (for commandant?), tested by route_ended
    &route_hero_leave_solitary[0],  // 37: set by charevnt_hero_release (for hero)

    &route_guard_12_bed[0],         // 38: guard 12 at 'time for bed', 'search light'
    &route_guard_13_bed[0],         // 39: guard 13 at 'time for bed', 'search light'
    &route_guard_14_bed[0],         // 40: guard 14 at 'time for bed', 'search light'
    &route_guard_15_bed[0],         // 41: guard 15 at 'time for bed', 'search light'

    &route_hut2_left_to_right[0],   // 42:

    &route_7833[0],                 // 43: set by charevnt_breakfast_vischar, process_player_input (was at breakfast case)
    &route_hut2_right_to_left[0],   // 44: set by process_player_input (was in bed case), set by character_bed_vischar (for the hero)

    &route_hero_roll_call[0],       // 45: (hero) by go_to_roll_call

    // original game has an FF byte here
  };

  /* Conv: The index may have its reverse flag set so mask it off. The
   * original game gets this for free when scaling the index. */
  index &= ~ROUTEINDEX_REVERSE_FLAG;

  assert(index < NELEMS(routes));

  return routes[index];
}